

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# otsshihua_test.cc
# Opt level: O2

int main(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  OtsShihuaInsertInstanceRequestType *this;
  HttpTestListener *this_00;
  undefined8 extraout_RAX;
  allocator<char> local_139;
  OtsShihuaListInstanceResponseType resp_3;
  OtsShihuaGetInstanceRequestType req_1;
  string local_f8;
  string local_d8 [32];
  string local_b8;
  OtsShihuaDeleteInstanceResponseType resp;
  OtsShihuaDeleteInstanceRequestType req;
  _Alloc_hider local_58;
  _Alloc_hider local_50;
  undefined1 local_48 [16];
  char local_38 [8];
  _Alloc_hider local_30;
  undefined1 local_28 [24];
  
  paVar1 = &req.instance_name.field_2;
  req.instance_name._M_string_length = 0;
  req.instance_name.field_2._M_local_buf[0] = '\0';
  req.instance_name._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&req_1,"cn-hangzhou",(allocator<char> *)&local_f8);
  std::__cxx11::string::string<std::allocator<char>>(local_d8,"my_appid",(allocator<char> *)&resp_3)
  ;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,"my_secret",&local_139);
  this = (OtsShihuaInsertInstanceRequestType *)
         aliyun::OtsShihua::CreateOtsShihuaClient(&req_1,local_d8,&local_b8);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string(local_d8);
  std::__cxx11::string::~string((string *)&req_1);
  if (this == (OtsShihuaInsertInstanceRequestType *)0x0) {
    std::__cxx11::string::~string((string *)&req);
    req_1.instance_name._M_dataplus._M_p = (pointer)&req_1.instance_name.field_2;
    req_1.instance_name._M_string_length = 0;
    req.instance_name._M_string_length = 0;
    req.instance_name.field_2._M_local_buf[0] = '\0';
    local_50._M_p = local_48 + 8;
    local_48._0_8_ = 0;
    req_1.instance_name.field_2._M_local_buf[0] = '\0';
    local_48[8] = '\0';
    local_30._M_p = local_28 + 8;
    local_28._0_8_ = 0;
    local_28[8] = '\0';
    req.instance_name._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::string<std::allocator<char>>
              (local_d8,"cn-hangzhou",(allocator<char> *)&resp_3);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b8,"my_appid",(allocator<char> *)&resp);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_f8,"my_secret",&local_139);
    this = (OtsShihuaInsertInstanceRequestType *)
           aliyun::OtsShihua::CreateOtsShihuaClient(local_d8,&local_b8,&local_f8);
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string(local_d8);
    if (this == (OtsShihuaInsertInstanceRequestType *)0x0) {
      aliyun::OtsShihuaGetInstanceInstanceInfoType::~OtsShihuaGetInstanceInstanceInfoType
                ((OtsShihuaGetInstanceInstanceInfoType *)&req);
      std::__cxx11::string::~string((string *)&req_1);
      req.instance_name._M_string_length = 0;
      req.instance_name.field_2._M_local_buf[0] = '\0';
      local_58._M_p = local_48;
      local_50._M_p = (pointer)0x0;
      local_48._0_8_ = local_48._0_8_ & 0xffffffffffffff00;
      local_38 = (char  [8])local_28;
      local_30._M_p = (pointer)0x0;
      local_28._0_8_ = local_28._0_8_ & 0xffffffffffffff00;
      req.instance_name._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&req_1,"cn-hangzhou",(allocator<char> *)&local_f8);
      std::__cxx11::string::string<std::allocator<char>>
                (local_d8,"my_appid",(allocator<char> *)&resp_3);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,"my_secret",&local_139)
      ;
      this = (OtsShihuaInsertInstanceRequestType *)
             aliyun::OtsShihua::CreateOtsShihuaClient(&req_1,local_d8,&local_b8);
      std::__cxx11::string::~string((string *)&local_b8);
      std::__cxx11::string::~string(local_d8);
      std::__cxx11::string::~string((string *)&req_1);
      if (this == (OtsShihuaInsertInstanceRequestType *)0x0) {
        aliyun::OtsShihuaInsertInstanceRequestType::~OtsShihuaInsertInstanceRequestType
                  ((OtsShihuaInsertInstanceRequestType *)&req);
        resp_3.instance_infos.
        super__Vector_base<aliyun::OtsShihuaListInstanceInstanceInfoType,_std::allocator<aliyun::OtsShihuaListInstanceInstanceInfoType>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        resp_3.instance_infos.
        super__Vector_base<aliyun::OtsShihuaListInstanceInstanceInfoType,_std::allocator<aliyun::OtsShihuaListInstanceInstanceInfoType>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        resp_3.instance_infos.
        super__Vector_base<aliyun::OtsShihuaListInstanceInstanceInfoType,_std::allocator<aliyun::OtsShihuaListInstanceInstanceInfoType>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&req,"cn-hangzhou",(allocator<char> *)&local_b8);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&req_1,"my_appid",(allocator<char> *)&local_f8);
        std::__cxx11::string::string<std::allocator<char>>
                  (local_d8,"my_secret",(allocator<char> *)&resp);
        this = (OtsShihuaInsertInstanceRequestType *)
               aliyun::OtsShihua::CreateOtsShihuaClient(&req,&req_1,local_d8);
        std::__cxx11::string::~string(local_d8);
        std::__cxx11::string::~string((string *)&req_1);
        std::__cxx11::string::~string((string *)&req);
        if (this == (OtsShihuaInsertInstanceRequestType *)0x0) {
          std::
          vector<aliyun::OtsShihuaListInstanceInstanceInfoType,_std::allocator<aliyun::OtsShihuaListInstanceInstanceInfoType>_>
          ::~vector(&resp_3.instance_infos);
          return 0;
        }
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_b8,"127.0.0.1:12234",(allocator<char> *)&local_f8);
        aliyun::OtsShihua::SetProxyHost((OtsShihua *)this,&local_b8);
        std::__cxx11::string::~string((string *)&local_b8);
        if ((char)(this->cluster_type)._M_string_length == '\x01') {
          *(undefined1 *)((long)&(this->cluster_type)._M_string_length + 1) = 0;
        }
        this_00 = (HttpTestListener *)operator_new(0x180);
        HttpTestListener::HttpTestListener(this_00,0x2fca);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_f8,
                   "{  \"InstanceInfos\": {    \"InstanceInfo\": [      {        \"InstanceName\": \"InstanceName\",        \"Timestamp\": \"Timestamp\"      }    ]  }}"
                   ,(allocator<char> *)&resp);
        HttpTestListener::SetResponseBody(this_00,&local_f8);
        std::__cxx11::string::~string((string *)&local_f8);
        HttpTestListener::Start(this_00);
        aliyun::OtsShihua::ListInstance
                  ((OtsShihuaListInstanceResponseType *)this,(OtsShihuaErrorInfo *)&resp_3);
        HttpTestListener::WaitComplete(this_00);
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_f8,"127.0.0.1:12234",(allocator<char> *)&resp_3);
        aliyun::OtsShihua::SetProxyHost((OtsShihua *)this,&local_f8);
        std::__cxx11::string::~string((string *)&local_f8);
        if ((char)(this->cluster_type)._M_string_length == '\x01') {
          *(undefined1 *)((long)&(this->cluster_type)._M_string_length + 1) = 0;
        }
        this_00 = (HttpTestListener *)operator_new(0x180);
        HttpTestListener::HttpTestListener(this_00,0x2fca);
        std::__cxx11::string::string<std::allocator<char>>((string *)&resp_3,"{}",&local_139);
        HttpTestListener::SetResponseBody(this_00,(string *)&resp_3);
        std::__cxx11::string::~string((string *)&resp_3);
        HttpTestListener::Start(this_00);
        std::__cxx11::string::assign((char *)&req);
        std::__cxx11::string::assign((char *)&local_58);
        std::__cxx11::string::assign(local_38);
        aliyun::OtsShihua::InsertInstance
                  (this,(OtsShihuaInsertInstanceResponseType *)&req,(OtsShihuaErrorInfo *)&resp);
        HttpTestListener::WaitComplete(this_00);
      }
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&resp_3,"127.0.0.1:12234",(allocator<char> *)&resp);
      aliyun::OtsShihua::SetProxyHost((OtsShihua *)this,(string *)&resp_3);
      std::__cxx11::string::~string((string *)&resp_3);
      if ((char)(this->cluster_type)._M_string_length == '\x01') {
        *(undefined1 *)((long)&(this->cluster_type)._M_string_length + 1) = 0;
      }
      this_00 = (HttpTestListener *)operator_new(0x180);
      HttpTestListener::HttpTestListener(this_00,0x2fca);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&resp,
                 "{  \"InstanceInfo\": {    \"InstanceName\": \"InstanceName\",    \"Status\": 0,    \"Description\": \"Description\",    \"Timestamp\": \"Timestamp\"  }}"
                 ,&local_139);
      HttpTestListener::SetResponseBody(this_00,(string *)&resp);
      std::__cxx11::string::~string((string *)&resp);
      HttpTestListener::Start(this_00);
      std::__cxx11::string::assign((char *)&req_1);
      aliyun::OtsShihua::GetInstance
                ((OtsShihuaGetInstanceRequestType *)this,(OtsShihuaGetInstanceResponseType *)&req_1,
                 (OtsShihuaErrorInfo *)&req);
      HttpTestListener::WaitComplete(this_00);
    }
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_f8,"127.0.0.1:12234",(allocator<char> *)&resp_3);
    aliyun::OtsShihua::SetProxyHost((OtsShihua *)this,&local_f8);
    std::__cxx11::string::~string((string *)&local_f8);
    if ((char)(this->cluster_type)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(this->cluster_type)._M_string_length + 1) = 0;
    }
    this_00 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(this_00,0x2fca);
    std::__cxx11::string::string<std::allocator<char>>((string *)&resp_3,"{}",&local_139);
    HttpTestListener::SetResponseBody(this_00,(string *)&resp_3);
    std::__cxx11::string::~string((string *)&resp_3);
    HttpTestListener::Start(this_00);
    std::__cxx11::string::assign((char *)&req);
    aliyun::OtsShihua::DeleteInstance
              ((OtsShihuaDeleteInstanceRequestType *)this,
               (OtsShihuaDeleteInstanceResponseType *)&req,(OtsShihuaErrorInfo *)&resp);
    HttpTestListener::WaitComplete(this_00);
  }
  HttpTestListener::~HttpTestListener(this_00);
  operator_delete(this_00,0x180);
  aliyun::OtsShihua::~OtsShihua((OtsShihua *)this);
  operator_delete(this,0x38);
  aliyun::OtsShihuaInsertInstanceRequestType::~OtsShihuaInsertInstanceRequestType
            ((OtsShihuaInsertInstanceRequestType *)&req);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

int main() {
  test_delete_instance();
  test_get_instance();
  test_insert_instance();
  test_list_instance();
}